

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_mul_mat_id(ggml_context *ctx,ggml_tensor *as,ggml_tensor *b,ggml_tensor *ids)

{
  _Bool _Var1;
  ggml_tensor *pgVar2;
  ggml_tensor *in_RCX;
  ggml_tensor *in_RDX;
  ggml_tensor *in_RSI;
  ggml_tensor *result;
  int64_t ne [4];
  int in_stack_ffffffffffffffa8;
  ggml_type in_stack_ffffffffffffffac;
  ggml_context *in_stack_ffffffffffffffb0;
  
  _Var1 = ggml_is_transposed(in_RSI);
  if (_Var1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c"
               ,0xae1,"GGML_ASSERT(%s) failed","!ggml_is_transposed(as)");
  }
  if (in_RCX->type != GGML_TYPE_I32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c"
               ,0xae2,"GGML_ASSERT(%s) failed","ids->type == GGML_TYPE_I32");
  }
  if (in_RSI->ne[3] != 1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c"
               ,0xae4,"GGML_ASSERT(%s) failed","as->ne[3] == 1");
  }
  if (in_RDX->ne[3] != 1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c"
               ,0xae5,"GGML_ASSERT(%s) failed","b->ne[3] == 1");
  }
  if ((in_RCX->ne[2] != 1) || (in_RCX->ne[3] != 1)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c"
               ,0xae6,"GGML_ASSERT(%s) failed","ids->ne[2] == 1 && ids->ne[3] == 1");
  }
  if (in_RCX->ne[1] != in_RDX->ne[2]) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c"
               ,0xae7,"GGML_ASSERT(%s) failed","ids->ne[1] == b->ne[2]");
  }
  if (in_RSI->ne[0] != in_RDX->ne[0]) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c"
               ,0xae8,"GGML_ASSERT(%s) failed","as->ne[0] == b->ne[0]");
  }
  if (in_RCX->ne[0] % in_RDX->ne[1] != 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c"
               ,0xae9,"GGML_ASSERT(%s) failed","ids->ne[0] % b->ne[1] == 0");
  }
  pgVar2 = ggml_new_tensor(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                           in_stack_ffffffffffffffa8,(int64_t *)0x14d055);
  pgVar2->op = GGML_OP_MUL_MAT_ID;
  pgVar2->src[0] = in_RSI;
  pgVar2->src[1] = in_RDX;
  pgVar2->src[2] = in_RCX;
  return pgVar2;
}

Assistant:

struct ggml_tensor * ggml_mul_mat_id(
        struct ggml_context * ctx,
        struct ggml_tensor  * as,
        struct ggml_tensor  * b,
        struct ggml_tensor  * ids) {
    GGML_ASSERT(!ggml_is_transposed(as));
    GGML_ASSERT(ids->type == GGML_TYPE_I32);

    GGML_ASSERT(as->ne[3] == 1); // as is 3d (one matrix per expert)
    GGML_ASSERT(b->ne[3] == 1); // b is 3d
    GGML_ASSERT(ids->ne[2] == 1 && ids->ne[3] == 1); // ids is 2d
    GGML_ASSERT(ids->ne[1] == b->ne[2]); // must have an expert list per b row
    GGML_ASSERT(as->ne[0] == b->ne[0]); // can_mul_mat
    GGML_ASSERT(ids->ne[0] % b->ne[1] == 0); // can broadcast

    const int64_t ne[4] = { as->ne[1], ids->ne[0], b->ne[2], 1 };
    struct ggml_tensor * result = ggml_new_tensor(ctx, GGML_TYPE_F32, 4, ne);

    result->op     = GGML_OP_MUL_MAT_ID;
    result->src[0] = as;
    result->src[1] = b;
    result->src[2] = ids;

    return result;
}